

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

void __thiscall google::CapturedStream::StopCapture(CapturedStream *this)

{
  int iVar1;
  ostream *poVar2;
  LogMessage local_28;
  LogMessageVoidify local_11;
  CapturedStream *local_10;
  CapturedStream *this_local;
  
  if (this->uncaptured_fd_ != -1) {
    local_10 = this;
    fflush((FILE *)0x0);
    iVar1 = dup2(this->uncaptured_fd_,this->fd_);
    if (iVar1 == -1) {
      LogMessageVoidify::LogMessageVoidify(&local_11);
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                 ,0x138);
      poVar2 = LogMessage::stream(&local_28);
      poVar2 = std::operator<<(poVar2,"Check failed: dup2(uncaptured_fd_, fd_) != -1 ");
      LogMessageVoidify::operator&(&local_11,poVar2);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
    }
  }
  return;
}

Assistant:

void StopCapture() {
    // Restore original stream
    if (uncaptured_fd_ != -1) {
      fflush(NULL);
      CHECK(dup2(uncaptured_fd_, fd_) != -1);
    }
  }